

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall mjs::parser::parse_unary_expression(parser *this)

{
  token_type tVar1;
  bool bVar2;
  int iVar3;
  wostream *pwVar4;
  socklen_t *in_RCX;
  wstring_view *s;
  wstring_view *s_00;
  token_type *in_RSI;
  wchar_t *in_R9;
  wstring_view message;
  wstring_view message_00;
  token_type t;
  wostringstream _oss;
  undefined1 local_200 [8];
  wstring local_1f8;
  undefined1 local_1d4 [12];
  undefined1 local_1c8 [48];
  wostringstream local_198 [376];
  
  tVar1 = in_RSI[0x20];
  local_1d4._0_4_ = tVar1;
  if ((((tVar1 - plusplus < 0x31) &&
       (in_RCX = (socklen_t *)0x1000000630003,
       (0x1000000630003U >> ((ulong)(tVar1 - plusplus) & 0x3f) & 1) != 0)) || (tVar1 == void_)) ||
     (tVar1 == typeof_)) {
    accept((parser *)(local_1c8 + 8),(int)in_RSI,(sockaddr *)(ulong)tVar1,in_RCX);
    token::destroy((token *)(local_1c8 + 8));
    parse_unary_expression((parser *)local_200);
    if ((char)in_RSI[0x18] == line_terminator) {
      if (tVar1 == delete_) {
        iVar3 = (**(code **)(*(long *)local_200 + 0x18))();
        if (iVar3 == 0) {
          std::__cxx11::wostringstream::wostringstream(local_198);
          pwVar4 = std::operator<<((wostream *)local_198,"May not delete unqualified identifier \"")
          ;
          local_1c8._0_8_ = *(undefined8 *)((long)&((wstring *)((long)local_200 + 8))->field_2 + 8);
          local_1d4._4_8_ = (((wstring *)((long)local_200 + 0x28))->_M_dataplus)._M_p;
          cpp_quote_abi_cxx11_((wstring *)(local_200 + 8),(mjs *)(local_1d4 + 4),s_00);
          pwVar4 = std::operator<<(pwVar4,(wstring *)(local_200 + 8));
          std::operator<<(pwVar4,"\" in strict mode");
          std::__cxx11::wstring::~wstring((wstring *)(local_200 + 8));
          std::__cxx11::wstringbuf::str();
          message_00._M_str = in_R9;
          message_00._M_len = (size_t)local_1f8._M_dataplus._M_p;
          syntax_error((parser *)"parse_unary_expression",(char *)0x240,local_200._0_4_ + 8,
                       (source_extend *)local_1f8._M_string_length,message_00);
        }
      }
      bVar2 = is_strict_mode_unassignable_identifier((expression *)local_200);
      if (bVar2) {
        std::__cxx11::wostringstream::wostringstream(local_198);
        pwVar4 = std::operator<<((wostream *)local_198,"\"");
        local_1c8._0_8_ = *(undefined8 *)((long)&((wstring *)((long)local_200 + 8))->field_2 + 8);
        local_1d4._4_8_ = (((wstring *)((long)local_200 + 0x28))->_M_dataplus)._M_p;
        cpp_quote_abi_cxx11_((wstring *)(local_200 + 8),(mjs *)(local_1d4 + 4),s);
        pwVar4 = std::operator<<(pwVar4,(wstring *)(local_200 + 8));
        std::operator<<(pwVar4,"\" may not be modified in strict mode");
        std::__cxx11::wstring::~wstring((wstring *)(local_200 + 8));
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = (size_t)local_1f8._M_dataplus._M_p;
        syntax_error((parser *)"parse_unary_expression",(char *)0x243,local_200._0_4_ + 8,
                     (source_extend *)local_1f8._M_string_length,message);
      }
    }
    make_expression<mjs::prefix_expression,mjs::token_type&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              (this,in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_1d4);
    if (local_200 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  else {
    parse_postfix_expression(this);
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_unary_expression() {
        switch (auto t = current_token_type(); t) {
        case token_type::delete_:
        case token_type::void_:
        case token_type::typeof_:
        case token_type::plusplus:
        case token_type::minusminus:
        case token_type::plus:
        case token_type::minus:
        case token_type::tilde:
        case token_type::not_:
            {
                accept(t);
                auto e = parse_unary_expression();
                if (strict_mode_) {
                    if (t == token_type::delete_ && e->type() == expression_type::identifier) {
                        SYNTAX_ERROR_AT("May not delete unqualified identifier \"" << cpp_quote(static_cast<const identifier_expression&>(*e).id()) << "\" in strict mode", e->extend());
                    }
                    if (is_strict_mode_unassignable_identifier(*e)) {
                        SYNTAX_ERROR_AT("\"" << cpp_quote(static_cast<const identifier_expression&>(*e).id()) << "\" may not be modified in strict mode", e->extend());
                    }
                }
                return make_expression<prefix_expression>(t, std::move(e));
            }
        default:
            return parse_postfix_expression();
        }
    }